

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O3

void google::protobuf::internal::RepeatedFieldHelper<2>::
     Serialize<google::protobuf::io::CodedOutputStream>
               (void *field,FieldMetadata *md,CodedOutputStream *output)

{
  float fVar1;
  undefined8 in_RAX;
  float *pfVar2;
  RepeatedField<float> *array;
  int index;
  undefined8 uStack_38;
  
  if (0 < *field) {
    index = 0;
    uStack_38 = in_RAX;
    do {
      uStack_38 = CONCAT44(md->tag,(undefined4)uStack_38);
      PrimitiveTypeHelper<13>::Serialize((void *)((long)&uStack_38 + 4),output);
      pfVar2 = RepeatedField<float>::Get((RepeatedField<float> *)field,index);
      fVar1 = *pfVar2;
      pfVar2 = (float *)output->cur_;
      if ((output->impl_).end_ <= pfVar2) {
        pfVar2 = (float *)io::EpsCopyOutputStream::EnsureSpaceFallback
                                    (&output->impl_,(uint8 *)pfVar2);
      }
      *pfVar2 = fVar1;
      output->cur_ = (uint8 *)(pfVar2 + 1);
      index = index + 1;
    } while (index < *field);
  }
  return;
}

Assistant:

static void Serialize(const void* field, const FieldMetadata& md, O* output) {
    typedef typename PrimitiveTypeHelper<type>::Type T;
    const RepeatedField<T>& array = Get<RepeatedField<T> >(field);
    for (int i = 0; i < array.size(); i++) {
      WriteTagTo(md.tag, output);
      SerializeTo<type>(&array[i], output);
    }
  }